

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

size_t __thiscall argparse::ArgumentParser::get_length_of_longest_argument(ArgumentParser *this)

{
  bool bVar1;
  size_type __n;
  iterator __first;
  iterator __last;
  reference puVar2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_78;
  unsigned_long *local_70;
  unsigned_long *local_60;
  _Base_ptr local_58;
  _Base_ptr local_50;
  allocator<unsigned_long> local_31;
  undefined1 local_30 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> argumentLengths;
  ArgumentParser *this_local;
  
  argumentLengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  bVar1 = std::
          map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
          ::empty(&this->mArgumentMap);
  if (bVar1) {
    this_local = (ArgumentParser *)0x0;
  }
  else {
    __n = std::
          map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
          ::size(&this->mArgumentMap);
    std::allocator<unsigned_long>::allocator(&local_31);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,__n,&local_31);
    std::allocator<unsigned_long>::~allocator(&local_31);
    local_50 = (_Base_ptr)
               std::
               begin<std::map<std::basic_string_view<char,std::char_traits<char>>,std::_List_iterator<argparse::Argument>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>>
                         (&this->mArgumentMap);
    local_58 = (_Base_ptr)
               std::
               end<std::map<std::basic_string_view<char,std::char_traits<char>>,std::_List_iterator<argparse::Argument>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>>
                         (&this->mArgumentMap);
    local_60 = (unsigned_long *)
               std::begin<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
    local_70 = (unsigned_long *)
               std::
               transform<std::_Rb_tree_const_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,argparse::ArgumentParser::get_length_of_longest_argument()const::_lambda(auto:1_const&)_1_>
                         (local_50,local_58,local_60);
    __first = std::begin<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
    __last = std::end<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
    local_78 = std::
               max_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                         (__first._M_current,__last._M_current);
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_78);
    this_local = (ArgumentParser *)*puVar2;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  }
  return (size_t)this_local;
}

Assistant:

size_t get_length_of_longest_argument() const {
    if (mArgumentMap.empty())
      return 0;
    std::vector<size_t> argumentLengths(mArgumentMap.size());
    std::transform(std::begin(mArgumentMap), std::end(mArgumentMap),
                   std::begin(argumentLengths), [](const auto &argPair) {
                     const auto &tArgument = argPair.second;
                     return tArgument->get_arguments_length();
                   });
    return *std::max_element(std::begin(argumentLengths),
                             std::end(argumentLengths));
  }